

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O3

CFavoriteServer * __thiscall
CServerBrowserFavorites::FindFavoriteByAddr(CServerBrowserFavorites *this,NETADDR *Addr,int *Index)

{
  int iVar1;
  NETADDR *b;
  long lVar2;
  
  iVar1 = this->m_NumFavoriteServers;
  if (0 < iVar1) {
    b = &this->m_aFavoriteServers[0].m_Addr;
    lVar2 = 0;
    do {
      if (2 < (int)b[1].type) {
        iVar1 = net_addr_comp(Addr,b,1);
        if (iVar1 == 0) {
          if (Index == (int *)0x0) {
            return (CFavoriteServer *)(b[-7].ip + 4);
          }
          *Index = (int)lVar2;
          return (CFavoriteServer *)(b[-7].ip + 4);
        }
        iVar1 = this->m_NumFavoriteServers;
      }
      lVar2 = lVar2 + 1;
      b = (NETADDR *)&b[7].port;
    } while (lVar2 < iVar1);
  }
  return (CFavoriteServer *)0x0;
}

Assistant:

CServerBrowserFavorites::CFavoriteServer *CServerBrowserFavorites::FindFavoriteByAddr(const NETADDR &Addr, int *Index)
{
	for(int i = 0; i < m_NumFavoriteServers; i++)
	{
		if(m_aFavoriteServers[i].m_State >= FAVSTATE_ADDR && net_addr_comp(&Addr, &m_aFavoriteServers[i].m_Addr, true) == 0)
		{
			if(Index)
				*Index = i;
			return &m_aFavoriteServers[i];
		}
	}

	return 0;
}